

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O2

bool __thiscall bssl::SSLTranscript::GetHash(SSLTranscript *this,uint8_t *out,size_t *out_len)

{
  int iVar1;
  bool bVar2;
  uint len;
  ScopedEVP_MD_CTX ctx;
  uint local_44;
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  local_40;
  
  EVP_MD_CTX_init((EVP_MD_CTX *)&local_40);
  iVar1 = EVP_MD_CTX_copy_ex((EVP_MD_CTX *)&local_40,(EVP_MD_CTX *)&this->hash_);
  if (iVar1 != 0) {
    iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)&local_40,out,&local_44);
    if (iVar1 != 0) {
      *out_len = (ulong)local_44;
      bVar2 = true;
      goto LAB_00230d6f;
    }
  }
  bVar2 = false;
LAB_00230d6f:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable(&local_40);
  return bVar2;
}

Assistant:

bool SSLTranscript::GetHash(uint8_t *out, size_t *out_len) const {
  ScopedEVP_MD_CTX ctx;
  unsigned len;
  if (!EVP_MD_CTX_copy_ex(ctx.get(), hash_.get()) ||
      !EVP_DigestFinal_ex(ctx.get(), out, &len)) {
    return false;
  }
  *out_len = len;
  return true;
}